

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

bool __thiscall
testing::internal::ExpectationBase::AllPrerequisitesAreSatisfied(ExpectationBase *this)

{
  bool bVar1;
  reference ppEVar2;
  pointer this_00;
  __shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *local_70;
  ExpectationBase *next;
  _Self local_60;
  const_iterator it;
  ExpectationBase *exp;
  allocator<const_testing::internal::ExpectationBase_*> local_39;
  ExpectationBase *local_38;
  undefined1 local_30 [8];
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  expectations;
  ExpectationBase *this_local;
  
  expectations.
  super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  local_38 = this;
  std::allocator<const_testing::internal::ExpectationBase_*>::allocator(&local_39);
  std::
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::vector((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
            *)local_30,1,&local_38,&local_39);
  std::allocator<const_testing::internal::ExpectationBase_*>::~allocator(&local_39);
  do {
    bVar1 = std::
            vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
            ::empty((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                     *)local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local._7_1_ = true;
LAB_00177039:
      std::
      vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
      ::~vector((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                 *)local_30);
      return this_local._7_1_;
    }
    ppEVar2 = std::
              vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
              ::back((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                      *)local_30);
    it._M_node = (_Base_ptr)*ppEVar2;
    std::
    vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
    ::pop_back((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                *)local_30);
    local_60._M_node = (_Base_ptr)ExpectationSet::begin((ExpectationSet *)&it._M_node[3]._M_left);
    while( true ) {
      next = (ExpectationBase *)ExpectationSet::end((ExpectationSet *)&it._M_node[3]._M_left);
      bVar1 = std::operator!=(&local_60,(_Self *)&next);
      if (!bVar1) break;
      this_00 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->(&local_60);
      this_01 = &Expectation::expectation_base(this_00)->
                 super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
      local_70 = std::__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>::
                 get(this_01);
      bVar1 = IsSatisfied(local_70);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_00177039;
      }
      std::
      vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
      ::push_back((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                   *)local_30,&local_70);
      std::_Rb_tree_const_iterator<testing::Expectation>::operator++(&local_60);
    }
  } while( true );
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();
      if (!next->IsSatisfied()) return false;
      expectations.push_back(next);
    }
  }
  return true;
}